

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::Dynamic_Proxy_Function::build_param_type_list
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,Param_Types *t_types)

{
  pointer *ppTVar1;
  pointer ppVar2;
  pointer_____offset_0x10___ *ppuVar3;
  pointer_____offset_0x10___ *ppuVar4;
  iterator __position;
  Type_Info *__args;
  pointer ppVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_49;
  Type_Info local_48;
  
  local_48._16_8_ = 0;
  local_48.m_type_info = (type_info *)&Boxed_Value::typeinfo;
  local_48.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (__return_storage_ptr__,__l,&local_49);
  ppVar5 = (t_types->m_types).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (t_types->m_types).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar2) {
    __args = &ppVar5->second;
    do {
      if ((__args->m_flags & 0x20) == 0) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>::
          _M_realloc_insert<chaiscript::Type_Info_const&>
                    ((vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          uVar6 = *(undefined4 *)&__args->field_0x14;
          (__position._M_current)->m_flags = __args->m_flags;
          *(undefined4 *)&(__position._M_current)->field_0x14 = uVar6;
          uVar6 = *(undefined4 *)&__args->m_type_info;
          uVar7 = *(undefined4 *)((long)&__args->m_type_info + 4);
          uVar8 = *(undefined4 *)&__args->m_bare_type_info;
          uVar9 = *(undefined4 *)((long)&__args->m_bare_type_info + 4);
LAB_002ab717:
          *(undefined4 *)&(__position._M_current)->m_type_info = uVar6;
          *(undefined4 *)((long)&(__position._M_current)->m_type_info + 4) = uVar7;
          *(undefined4 *)&(__position._M_current)->m_bare_type_info = uVar8;
          *(undefined4 *)((long)&(__position._M_current)->m_bare_type_info + 4) = uVar9;
          ppTVar1 = &(__return_storage_ptr__->
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
      }
      else {
        local_48.m_type_info = (type_info *)&Boxed_Value::typeinfo;
        ppuVar3 = (pointer_____offset_0x10___ *)local_48.m_type_info;
        local_48.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
        ppuVar4 = (pointer_____offset_0x10___ *)local_48.m_bare_type_info;
        local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (__return_storage_ptr__->
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          (__position._M_current)->m_flags = local_48.m_flags;
          *(undefined4 *)&(__position._M_current)->field_0x14 = local_48._20_4_;
          local_48.m_type_info._0_4_ = 0x3c48b0;
          local_48.m_type_info._4_4_ = 0;
          local_48.m_bare_type_info._0_4_ = 0x3c48b0;
          local_48.m_bare_type_info._4_4_ = 0;
          uVar6 = local_48.m_type_info._0_4_;
          uVar7 = local_48.m_type_info._4_4_;
          uVar8 = local_48.m_bare_type_info._0_4_;
          uVar9 = local_48.m_bare_type_info._4_4_;
          local_48.m_type_info = (type_info *)ppuVar3;
          local_48.m_bare_type_info = (type_info *)ppuVar4;
          goto LAB_002ab717;
        }
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
        _M_realloc_insert<chaiscript::Type_Info>(__return_storage_ptr__,__position,&local_48);
      }
      ppVar5 = (pointer)(__args + 1);
      __args = (Type_Info *)&__args[2].m_bare_type_info;
    } while (ppVar5 != ppVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_param_type_list(const Param_Types &t_types) {
        // For the return type
        std::vector<Type_Info> types{chaiscript::detail::Get_Type_Info<Boxed_Value>::get()};

        for (const auto &t : t_types.types()) {
          if (t.second.is_undef()) {
            types.push_back(chaiscript::detail::Get_Type_Info<Boxed_Value>::get());
          } else {
            types.push_back(t.second);
          }
        }

        return types;
      }